

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jas_cm.c
# Opt level: O0

int icctoclrspc(int iccclrspc,int refflag)

{
  int refflag_local;
  int iccclrspc_local;
  
  if (refflag == 0) {
    if (iccclrspc == 0x47524159) {
      refflag_local = 0x300;
    }
    else if (iccclrspc == 0x52474220) {
      refflag_local = 0x400;
    }
    else {
      if (iccclrspc != 0x59436272) {
        abort();
      }
      refflag_local = 0x500;
    }
  }
  else if (iccclrspc == 0x4c616220) {
    refflag_local = 0x201;
  }
  else {
    if (iccclrspc != 0x58595a20) {
      abort();
    }
    refflag_local = 0x101;
  }
  return refflag_local;
}

Assistant:

static int icctoclrspc(int iccclrspc, int refflag)
{
	if (refflag) {
		switch (iccclrspc) {
		case JAS_ICC_COLORSPC_XYZ:
			return JAS_CLRSPC_CIEXYZ;
		case JAS_ICC_COLORSPC_LAB:
			return JAS_CLRSPC_CIELAB;
		default:
			abort();
			break;
		}
	} else {
		switch (iccclrspc) {
		case JAS_ICC_COLORSPC_YCBCR:
			return JAS_CLRSPC_GENYCBCR;
		case JAS_ICC_COLORSPC_RGB:
			return JAS_CLRSPC_GENRGB;
		case JAS_ICC_COLORSPC_GRAY:
			return JAS_CLRSPC_GENGRAY;
		default:
			abort();
			break;
		}
	}
}